

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O0

void Wlc_BlastSubtract(Gia_Man_t *pNew,int *pAdd0,int *pAdd1,int nBits,int Carry)

{
  int a;
  int *pNew_00;
  int b_00;
  int local_2c;
  int local_28;
  int b;
  int Carry_local;
  int nBits_local;
  int *pAdd1_local;
  int *pAdd0_local;
  Gia_Man_t *pNew_local;
  
  local_28 = Carry;
  b = nBits;
  _Carry_local = pAdd1;
  pAdd1_local = pAdd0;
  pAdd0_local = (int *)pNew;
  for (local_2c = 0; pNew_00 = pAdd0_local, local_2c < b; local_2c = local_2c + 1) {
    a = pAdd1_local[local_2c];
    b_00 = Abc_LitNot(_Carry_local[local_2c]);
    Wlc_BlastFullAdder((Gia_Man_t *)pNew_00,a,b_00,local_28,&local_28,pAdd1_local + local_2c);
  }
  return;
}

Assistant:

void Wlc_BlastSubtract( Gia_Man_t * pNew, int * pAdd0, int * pAdd1, int nBits, int Carry ) // result is in pAdd0
{
    int b;
    for ( b = 0; b < nBits; b++ )
        Wlc_BlastFullAdder( pNew, pAdd0[b], Abc_LitNot(pAdd1[b]), Carry, &Carry, &pAdd0[b] );
}